

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

void wasm::copy_file(string *input,string *output)

{
  streambuf *psVar1;
  PathString local_470;
  undefined1 local_450 [8];
  ofstream dst;
  PathString local_240;
  undefined1 local_220 [8];
  ifstream src;
  string *output_local;
  string *input_local;
  
  Path::to_path(&local_240,input);
  std::ifstream::ifstream(local_220,(string *)&local_240,_S_bin);
  std::__cxx11::string::~string((string *)&local_240);
  Path::to_path(&local_470,output);
  std::ofstream::ofstream(local_450,(string *)&local_470,_S_bin);
  std::__cxx11::string::~string((string *)&local_470);
  psVar1 = (streambuf *)std::ifstream::rdbuf();
  std::ostream::operator<<(local_450,psVar1);
  std::ofstream::~ofstream(local_450);
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

void wasm::copy_file(std::string input, std::string output) {
  std::ifstream src(wasm::Path::to_path(input), std::ios::binary);
  std::ofstream dst(wasm::Path::to_path(output), std::ios::binary);
  dst << src.rdbuf();
}